

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardhandler.cpp
# Opt level: O3

void __thiscall QEvdevKeyboardHandler::readKeycode(QEvdevKeyboardHandler *this)

{
  int iVar1;
  QKeycodeAction QVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  QKeycodeAction QVar6;
  uint uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  input_event buffer [32];
  undefined1 local_338 [20];
  int local_324 [187];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_338,0xaa,0x300);
  uVar8 = 0;
LAB_001261c8:
  do {
    iVar1 = (this->m_fd).m_fd;
    do {
      sVar3 = read(iVar1,local_338 + uVar8,0x300 - uVar8);
      if (sVar3 != -1) {
        iVar1 = (int)sVar3;
        if (iVar1 == 0) {
          readKeycode();
          goto LAB_001262e5;
        }
        if (-1 < iVar1) {
          uVar7 = (int)uVar8 + iVar1;
          uVar8 = (ulong)uVar7;
          if (0xaaaaaaa < (uVar7 * -0x55555555 >> 3 | uVar7 * 0x60000000)) goto LAB_001261c8;
          if (uVar7 < 0x18) goto LAB_001262e5;
          uVar8 = (ulong)(uVar7 / 0x18);
          piVar4 = local_324;
          goto LAB_0012624f;
        }
        piVar4 = __errno_location();
        iVar5 = *piVar4;
        break;
      }
      piVar4 = __errno_location();
      iVar5 = *piVar4;
    } while (iVar5 == 4);
  } while ((iVar5 == 4) || (iVar5 == 0xb));
  readKeycode();
  goto LAB_001262e5;
LAB_0012624f:
  do {
    if ((short)piVar4[-1] == 1) {
      QVar2 = processKeycode(this,*(quint16 *)((long)piVar4 + -2),*piVar4 != 0,*piVar4 == 2);
      if (QVar2 - CapsLockOff < 2) {
        iVar1 = 1;
        QVar6 = CapsLockOn;
      }
      else if (QVar2 + 0xfd000000 < 2) {
        iVar1 = 2;
        QVar6 = ScrollLockOn;
      }
      else {
        if (1 < QVar2 + 0xfe000000) goto LAB_001262c5;
        iVar1 = 0;
        QVar6 = NumLockOn;
      }
      switchLed(this,iVar1,QVar2 == QVar6);
    }
LAB_001262c5:
    piVar4 = piVar4 + 6;
    uVar8 = uVar8 - 1;
  } while (uVar8 != 0);
LAB_001262e5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevKeyboardHandler::readKeycode()
{
    struct ::input_event buffer[32];
    int n = 0;

    forever {
        int result = qt_safe_read(m_fd.get(), reinterpret_cast<char *>(buffer) + n, sizeof(buffer) - n);

        if (result == 0) {
            qWarning("evdevkeyboard: Got EOF from the input device");
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning("evdevkeyboard: Could not read from input device");
                // If the device got disconnected, stop reading, otherwise we get flooded
                // by the above error over and over again.
                if (errno == ENODEV) {
                    delete m_notify;
                    m_notify = nullptr;
                    m_fd.reset();
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(buffer[0]) == 0)
                break;
        }
    }